

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Copy.cpp
# Opt level: O3

void __thiscall ObserverManager_Stack_Test::TestBody(ObserverManager_Stack_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  A a;
  stringstream out;
  string local_208;
  AssertHelper local_1e8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  AssertHelper local_1d8;
  A local_1d0;
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(local_198);
  paVar1 = &local_208.field_2;
  local_208._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"A","");
  A::A(&local_1d0,local_188,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  ObserverManager::subscribe<FooBarProtocol,A>(&local_1d0);
  ObserverManager::notify<FooBarProtocol>((ObserverManager *)0x11,0);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&local_1e8,"\"A \"","out.str()",(char (*) [3])0x1497bb,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if (local_1e8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_208);
    if (local_1e0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_1e0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Copy.cpp"
               ,0xe,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_208._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1d0.super_FooBarProtocol.super_BaseObserverProtocol._vptr_BaseObserverProtocol =
       (_func_int **)&PTR__A_0015bd60;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.name._M_dataplus._M_p != &local_1d0.name.field_2) {
    operator_delete(local_1d0.name._M_dataplus._M_p);
  }
  BaseObserverProtocol::~BaseObserverProtocol((BaseObserverProtocol *)&local_1d0);
  ObserverManager::notify<FooBarProtocol>((ObserverManager *)0x11,0);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&local_208,"\"A \"","out.str()",(char (*) [3])0x1497bb,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0);
  if ((StreamWriter *)
      local_1d0.super_FooBarProtocol.super_BaseObserverProtocol._vptr_BaseObserverProtocol !=
      &local_1d0.super_StreamWriter) {
    operator_delete(local_1d0.super_FooBarProtocol.super_BaseObserverProtocol.
                    _vptr_BaseObserverProtocol);
  }
  if ((char)local_208._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_1d0);
    if ((undefined8 *)local_208._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_208._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Copy.cpp"
               ,0x12,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    if (local_1d0.super_FooBarProtocol.super_BaseObserverProtocol._vptr_BaseObserverProtocol !=
        (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_1d0.super_FooBarProtocol.super_BaseObserverProtocol._vptr_BaseObserverProtocol !=
          (_func_int **)0x0)) {
        (**(code **)(*local_1d0.super_FooBarProtocol.super_BaseObserverProtocol.
                      _vptr_BaseObserverProtocol + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_208._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

TEST(ObserverManager, Stack) {
    std::stringstream out;

    {
        A a(out, "A");
        ObserverManager::subscribe<FooBarProtocol>(&a);
        ObserverManager::notify(&FooBarProtocol::foo);
        EXPECT_EQ("A ", out.str());
    }

    ObserverManager::notify(&FooBarProtocol::foo);
    EXPECT_EQ("A ", out.str());
}